

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O1

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_useRowMatchFinderMode_e useRowMatchFinder,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  rawSeq *prVar2;
  undefined8 *puVar3;
  BYTE *pBVar4;
  undefined8 *puVar5;
  BYTE *pBVar6;
  seqDef *psVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar11;
  ZSTD_dictMode_e dictMode;
  uint uVar12;
  uint uVar13;
  BYTE *pBVar14;
  ulong uVar15;
  undefined8 *puVar16;
  long lVar17;
  ulong uVar19;
  ulong uVar20;
  void *pvVar21;
  BYTE *litLimit_w;
  U32 UVar18;
  
  dictMode = ZSTD_extDict;
  if ((ms->window).dictLimit <= (ms->window).lowLimit) {
    if (ms->dictMatchState == (ZSTD_matchState_t *)0x0) {
      dictMode = ZSTD_noDict;
    }
    else {
      dictMode = ZSTD_dedicatedDictSearch - (ms->dictMatchState->dedicatedDictSearch == 0);
    }
  }
  uVar10 = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE =
       ZSTD_selectBlockCompressor((ms->cParams).strategy,useRowMatchFinder,dictMode);
  if (ZSTD_btlazy2 < (ms->cParams).strategy) {
    ms->ldmSeqStore = rawSeqStore;
    sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,srcSize);
    ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore,srcSize);
    return sVar11;
  }
  pvVar21 = (void *)(srcSize + (long)src);
  puVar1 = (undefined8 *)((long)pvVar21 - 0x20);
  do {
    uVar19 = rawSeqStore->pos;
    if ((rawSeqStore->size <= uVar19) || (pvVar21 <= src)) break;
    prVar2 = rawSeqStore->seq + uVar19;
    uVar20._0_4_ = prVar2->offset;
    uVar20._4_4_ = prVar2->litLength;
    uVar15 = uVar20 >> 0x20;
    uVar13 = rawSeqStore->seq[uVar19].matchLength;
    uVar9 = (uint)((long)pvVar21 - (long)src);
    if (uVar9 < uVar13 + uVar20._4_4_) {
      uVar19 = uVar20;
      if (uVar9 - uVar20._4_4_ < uVar10) {
        uVar19 = 0;
      }
      uVar12 = uVar9 - uVar20._4_4_;
      if (uVar9 < (uint)uVar20._4_4_ || uVar9 - uVar20._4_4_ == 0) {
        uVar19 = 0;
        uVar12 = uVar13;
      }
      uVar13 = uVar12;
      ZSTD_ldm_skipSequences(rawSeqStore,(long)pvVar21 - (long)src & 0xffffffff,uVar10);
      uVar20 = uVar19;
    }
    else {
      rawSeqStore->pos = uVar19 + 1;
    }
    UVar18 = (U32)uVar20;
    if (UVar18 != 0) {
      uVar9 = (int)src - *(int *)&(ms->window).base;
      if (ms->nextToUpdate + 0x400 < uVar9) {
        uVar12 = (uVar9 - ms->nextToUpdate) - 0x400;
        if (0x1ff < uVar12) {
          uVar12 = 0x200;
        }
        ms->nextToUpdate = uVar9 - uVar12;
      }
      ZSTD_ldm_fillFastTables(ms,src);
      sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar15);
      *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
      puVar3 = (undefined8 *)(uVar15 + (long)src);
      *rep = UVar18;
      puVar16 = (undefined8 *)((long)puVar3 - sVar11);
      if (puVar1 < puVar3) {
        pBVar6 = seqStore->lit;
        pBVar14 = pBVar6;
        if (puVar16 <= puVar1) {
          lVar17 = (long)puVar1 - (long)puVar16;
          pBVar14 = pBVar6 + lVar17;
          uVar8 = puVar16[1];
          *(undefined8 *)pBVar6 = *puVar16;
          *(undefined8 *)(pBVar6 + 8) = uVar8;
          puVar16 = puVar1;
          if (0x10 < lVar17) {
            lVar17 = 0x10;
            do {
              puVar5 = (undefined8 *)((long)src + lVar17 + (uVar15 - sVar11));
              uVar8 = puVar5[1];
              pBVar4 = pBVar6 + lVar17;
              *(undefined8 *)pBVar4 = *puVar5;
              *(undefined8 *)(pBVar4 + 8) = uVar8;
              puVar5 = (undefined8 *)((long)src + lVar17 + (uVar15 - sVar11) + 0x10);
              uVar8 = puVar5[1];
              *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
              *(undefined8 *)(pBVar4 + 0x18) = uVar8;
              lVar17 = lVar17 + 0x20;
            } while (pBVar4 + 0x20 < pBVar14);
          }
        }
        if (puVar16 < puVar3) {
          lVar17 = 0;
          do {
            pBVar14[lVar17] = *(BYTE *)((long)puVar16 + lVar17);
            lVar17 = lVar17 + 1;
          } while ((long)puVar3 - (long)puVar16 != lVar17);
        }
      }
      else {
        pBVar14 = seqStore->lit;
        uVar8 = puVar16[1];
        *(undefined8 *)pBVar14 = *puVar16;
        *(undefined8 *)(pBVar14 + 8) = uVar8;
        if (0x10 < sVar11) {
          pBVar14 = seqStore->lit;
          uVar8 = puVar16[3];
          *(undefined8 *)(pBVar14 + 0x10) = puVar16[2];
          *(undefined8 *)(pBVar14 + 0x18) = uVar8;
          if (0x20 < (long)sVar11) {
            lVar17 = 0;
            do {
              puVar16 = (undefined8 *)((long)src + lVar17 + (uVar15 - sVar11) + 0x20);
              uVar8 = puVar16[1];
              pBVar6 = pBVar14 + lVar17 + 0x20;
              *(undefined8 *)pBVar6 = *puVar16;
              *(undefined8 *)(pBVar6 + 8) = uVar8;
              puVar16 = (undefined8 *)((long)src + lVar17 + (uVar15 - sVar11) + 0x30);
              uVar8 = puVar16[1];
              *(undefined8 *)(pBVar6 + 0x10) = *puVar16;
              *(undefined8 *)(pBVar6 + 0x18) = uVar8;
              lVar17 = lVar17 + 0x20;
            } while (pBVar6 + 0x20 < pBVar14 + sVar11);
          }
        }
      }
      seqStore->lit = seqStore->lit + sVar11;
      if (0xffff < sVar11) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
      psVar7 = seqStore->sequences;
      psVar7->litLength = (U16)sVar11;
      psVar7->offset = UVar18 + 3;
      if (0xffff < uVar13 - 3) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar7->matchLength = (U16)(uVar13 - 3);
      seqStore->sequences = psVar7 + 1;
      src = (void *)((long)puVar3 + (ulong)uVar13);
    }
  } while (UVar18 != 0);
  uVar10 = (int)src - *(int *)&(ms->window).base;
  if (ms->nextToUpdate + 0x400 < uVar10) {
    uVar13 = (uVar10 - ms->nextToUpdate) - 0x400;
    if (0x1ff < uVar13) {
      uVar13 = 0x200;
    }
    ms->nextToUpdate = uVar10 - uVar13;
  }
  ZSTD_ldm_fillFastTables(ms,src);
  sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,(long)pvVar21 - (long)src);
  return sVar11;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_useRowMatchFinderMode_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}